

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O0

void __thiscall
dlib::any_function<void_(),_void,_0UL>::derived<dlib::impl::image_display_functor,_void_()>::derived
          (derived<dlib::impl::image_display_functor,_void_()> *this,image_display_functor *val)

{
  type piVar1;
  image_display_functor *in_RSI;
  Tbase<void_()> *in_RDI;
  image_display_functor *in_stack_ffffffffffffffe0;
  
  Tbase<void_()>::Tbase(in_RDI);
  in_RDI->_vptr_Tbase = (_func_int **)&PTR__derived_0055f420;
  piVar1 = copy<dlib::impl::image_display_functor>(in_RSI);
  impl::image_display_functor::image_display_functor(in_stack_ffffffffffffffe0,piVar1);
  return;
}

Assistant:

DLIB_ANY_FUNCTION_DERIVED_BOILERPLATE

    virtual result_type evaluate (
    ) const { DLIB_ANY_FUNCTION_RETURN item(); }